

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_neg_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_32_fc((int)(short)uVar1,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.not_z_flag = -uVar2;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.x_flag = (uVar2 | m68ki_cpu.not_z_flag) >> 0x17;
  m68ki_cpu.v_flag = (uVar2 & m68ki_cpu.not_z_flag) >> 0x18;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_32_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_neg_32_aw(void)
{
	uint ea = EA_AW_32();
	uint src = m68ki_read_32(ea);
	uint res = 0 - src;

	FLAG_N = NFLAG_32(res);
	FLAG_C = FLAG_X = CFLAG_SUB_32(src, 0, res);
	FLAG_V = (src & res)>>24;
	FLAG_Z = MASK_OUT_ABOVE_32(res);

	m68ki_write_32(ea, FLAG_Z);
}